

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

ALLEGRO_DISPLAY * al_create_display(int w,int h)

{
  ALLEGRO_COLOR color;
  _Bool _Var1;
  uint display_flags;
  ALLEGRO_SYSTEM *pAVar2;
  ALLEGRO_DISPLAY_INTERFACE *pAVar3;
  ALLEGRO_SHADER *pAVar4;
  int in_ESI;
  int in_EDI;
  ALLEGRO_COLOR AVar5;
  int unaff_retaddr;
  char *in_stack_00000008;
  int flags;
  ALLEGRO_EXTRA_DISPLAY_SETTINGS *settings;
  ALLEGRO_DISPLAY *display;
  ALLEGRO_DISPLAY_INTERFACE *driver;
  ALLEGRO_SYSTEM *system;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  ALLEGRO_DISPLAY *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  ALLEGRO_EXTRA_DISPLAY_SETTINGS *pAVar6;
  char *in_stack_fffffffffffffff8;
  ALLEGRO_DISPLAY *pAVar7;
  
  pAVar2 = al_get_system_driver();
  pAVar3 = (*pAVar2->vt->get_display_driver)();
  if (pAVar3 == (ALLEGRO_DISPLAY_INTERFACE *)0x0) {
    _Var1 = _al_trace_prefix((char *)settings,flags,in_stack_00000008,unaff_retaddr,
                             in_stack_fffffffffffffff8);
    if (_Var1) {
      _al_trace_suffix("Failed to create display (no display driver)\n");
    }
    pAVar7 = (ALLEGRO_DISPLAY *)0x0;
  }
  else {
    pAVar7 = (*pAVar3->create_display)(in_EDI,in_ESI);
    if (pAVar7 == (ALLEGRO_DISPLAY *)0x0) {
      _Var1 = _al_trace_prefix((char *)settings,flags,in_stack_00000008,unaff_retaddr,
                               in_stack_fffffffffffffff8);
      if (_Var1) {
        _al_trace_suffix("Failed to create display (NULL)\n");
      }
      pAVar7 = (ALLEGRO_DISPLAY *)0x0;
    }
    else {
      pAVar6 = &pAVar7->extra_settings;
      display_flags = (uint)pAVar6->required | (uint)(pAVar7->extra_settings).suggested;
      if ((display_flags & 0x80000000) == 0) {
        (pAVar7->extra_settings).settings[0x1f] = 1;
      }
      pAVar7->min_w = 0;
      pAVar7->min_h = 0;
      pAVar7->max_w = 0;
      pAVar7->max_h = 0;
      pAVar7->use_constraints = false;
      pAVar7->extra_resize_height = 0;
      pAVar7->vertex_cache = (void *)0x0;
      pAVar7->num_cache_vertices = 0;
      pAVar7->cache_enabled = false;
      pAVar7->vertex_cache_size = 0;
      pAVar7->cache_texture = 0;
      al_identity_transform(&pAVar7->projview_transform);
      pAVar7->default_shader = (ALLEGRO_SHADER *)0x0;
      _al_vector_init(&pAVar7->display_invalidated_callbacks,8);
      _al_vector_init(&pAVar7->display_validated_callbacks,8);
      (pAVar7->render_state).write_mask = 0x1f;
      (pAVar7->render_state).depth_test = 0;
      (pAVar7->render_state).depth_function = 2;
      (pAVar7->render_state).alpha_test = 0;
      (pAVar7->render_state).alpha_function = 1;
      (pAVar7->render_state).alpha_test_value = 0;
      _al_vector_init(&pAVar7->bitmaps,8);
      if (pAVar6->settings[0x18] == 0) {
        _Var1 = _al_trace_prefix((char *)settings,flags,in_stack_00000008,unaff_retaddr,
                                 in_stack_fffffffffffffff8);
        if (_Var1) {
          _al_trace_suffix("ALLEGRO_COMPATIBLE_DISPLAY not set\n");
        }
        _al_set_current_display_only
                  ((ALLEGRO_DISPLAY *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8))
        ;
      }
      else {
        al_get_backbuffer((ALLEGRO_DISPLAY *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
        al_set_target_bitmap((ALLEGRO_BITMAP *)CONCAT44(in_EDI,in_ESI));
      }
      if ((pAVar7->flags & 0x800U) != 0) {
        pAVar4 = _al_create_default_shader(display_flags);
        pAVar7->default_shader = pAVar4;
        if (pAVar7->default_shader == (ALLEGRO_SHADER *)0x0) {
          al_destroy_display(in_stack_ffffffffffffffc0);
          return (ALLEGRO_DISPLAY *)0x0;
        }
        al_use_shader((ALLEGRO_SHADER *)CONCAT44(display_flags,in_stack_ffffffffffffffc8));
      }
      if (pAVar6->settings[0x18] != 0) {
        AVar5 = al_map_rgb('\0','\0','\0');
        color.g = (float)display_flags;
        color.r = AVar5.a;
        color._8_8_ = pAVar6;
        al_clear_to_color(color);
      }
      if (pAVar6->settings[0x1f] != 0) {
        al_convert_memory_bitmaps();
      }
    }
  }
  return pAVar7;
}

Assistant:

ALLEGRO_DISPLAY *al_create_display(int w, int h)
{
   ALLEGRO_SYSTEM *system;
   ALLEGRO_DISPLAY_INTERFACE *driver;
   ALLEGRO_DISPLAY *display;
   ALLEGRO_EXTRA_DISPLAY_SETTINGS *settings;
   int flags;

   system = al_get_system_driver();
   driver = system->vt->get_display_driver();
   if (!driver) {
      ALLEGRO_ERROR("Failed to create display (no display driver)\n");
      return NULL;
   }

   display = driver->create_display(w, h);
   if (!display) {
      ALLEGRO_ERROR("Failed to create display (NULL)\n");
      return NULL;
   }

   ASSERT(display->vt);

   settings = &display->extra_settings;
   flags = settings->required | settings->suggested;
   if (!(flags & (1 << ALLEGRO_AUTO_CONVERT_BITMAPS))) {
      settings->settings[ALLEGRO_AUTO_CONVERT_BITMAPS] = 1;
   }

   display->min_w = 0;
   display->min_h = 0;
   display->max_w = 0;
   display->max_h = 0;
   display->use_constraints = false;
   display->extra_resize_height = 0;

   display->vertex_cache = 0;
   display->num_cache_vertices = 0;
   display->cache_enabled = false;
   display->vertex_cache_size = 0;
   display->cache_texture = 0;
   al_identity_transform(&display->projview_transform);

   display->default_shader = NULL;

   _al_vector_init(&display->display_invalidated_callbacks, sizeof(void *));
   _al_vector_init(&display->display_validated_callbacks, sizeof(void *));

   display->render_state.write_mask = ALLEGRO_MASK_RGBA | ALLEGRO_MASK_DEPTH;
   display->render_state.depth_test = false;
   display->render_state.depth_function = ALLEGRO_RENDER_LESS;
   display->render_state.alpha_test = false;
   display->render_state.alpha_function = ALLEGRO_RENDER_ALWAYS;
   display->render_state.alpha_test_value = 0;

   _al_vector_init(&display->bitmaps, sizeof(ALLEGRO_BITMAP*));

   if (settings->settings[ALLEGRO_COMPATIBLE_DISPLAY]) {
      al_set_target_bitmap(al_get_backbuffer(display));
   }
   else {
      ALLEGRO_DEBUG("ALLEGRO_COMPATIBLE_DISPLAY not set\n");
      _al_set_current_display_only(display);
   }

   if (display->flags & ALLEGRO_PROGRAMMABLE_PIPELINE) {
      display->default_shader = _al_create_default_shader(display->flags);
      if (!display->default_shader) {
         al_destroy_display(display);
         return NULL;
      }
      al_use_shader(display->default_shader);
   }

   /* Clear the screen */
   if (settings->settings[ALLEGRO_COMPATIBLE_DISPLAY]) {
      al_clear_to_color(al_map_rgb(0, 0, 0));

      /* TODO:
       * on iphone, don't kill the initial splashscreen - in fact, it's also
       * annoying in linux to have an extra black frame as first frame and I
       * suppose we never really want it
       */
#if 0
      al_flip_display();
#endif
   }

   if (settings->settings[ALLEGRO_AUTO_CONVERT_BITMAPS]) {
      /* We convert video bitmaps to memory bitmaps when the display is
       * destroyed, so seems only fair to re-convertt hem when the
       * display is re-created again.
       */
      al_convert_memory_bitmaps();
   }

   return display;
}